

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

PulseStyleSymbol *
slang::ast::PulseStyleSymbol::fromSyntax(Scope *parent,PulseStyleDeclarationSyntax *syntax)

{
  Compilation *this;
  PulseStyleSymbol *pPVar1;
  PulseStyleKind pulseStyleKind;
  PulseStyleKind local_34;
  SourceLocation local_30;
  Token local_28;
  
  local_34 = SemanticFacts::getPulseStyleKind((syntax->keyword).kind);
  this = parent->compilation;
  local_28 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_30 = parsing::Token::location(&local_28);
  pPVar1 = BumpAllocator::
           emplace<slang::ast::PulseStyleSymbol,slang::SourceLocation,slang::ast::PulseStyleKind&>
                     (&this->super_BumpAllocator,&local_30,&local_34);
  (pPVar1->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pPVar1;
}

Assistant:

PulseStyleSymbol& PulseStyleSymbol::fromSyntax(const Scope& parent,
                                               const PulseStyleDeclarationSyntax& syntax) {
    auto pulseStyleKind = SemanticFacts::getPulseStyleKind(syntax.keyword.kind);

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<PulseStyleSymbol>(syntax.getFirstToken().location(), pulseStyleKind);
    result->setSyntax(syntax);
    return *result;
}